

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastV64S1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ParseContext *pPVar1;
  MessageLite *pMVar2;
  uint64_t uVar3;
  TcParseTableBase *this;
  uchar uVar4;
  int8_t iVar5;
  byte bVar6;
  bool bVar7;
  uint16_t uVar8;
  unsigned_short uVar9;
  uint uVar10;
  char *pcVar11;
  unsigned_long *puVar12;
  uint *puVar13;
  ulong uVar14;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2c0;
  ulong local_2b8;
  int64_t res;
  uint64_t local_2a8;
  TcParseTableBase *local_2a0;
  ParseContext *local_298;
  char *local_290;
  MessageLite *local_288;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_280;
  TcFieldData local_278;
  TcFieldData local_270;
  undefined1 local_261;
  ulong uStack_260;
  bool always_return;
  TcParseTableBase *local_258;
  ParseContext *local_250;
  char *local_248;
  MessageLite *local_240;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_238;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_230;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_228;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  ulong local_188;
  int64_t res3;
  int64_t res2;
  anon_class_8_1_54a39810 last;
  anon_class_8_1_54a39810 next;
  bool kIs32BitVarint;
  bool kIs64BitVarint;
  char *local_158;
  char *local_150;
  int64_t *local_148;
  int8_t local_131;
  ulong *local_130;
  int8_t local_119;
  int64_t *local_118;
  int8_t local_101;
  ulong *local_100;
  int8_t local_e9;
  int8_t local_d9;
  int8_t local_c9;
  int8_t local_b9;
  int8_t local_a9;
  int64_t *local_a8;
  int8_t local_91;
  ulong *local_90;
  int8_t local_79;
  int64_t *local_78;
  int8_t local_61;
  ulong *local_60;
  int8_t local_49;
  int8_t local_39;
  int8_t local_29;
  int8_t local_19;
  int8_t local_9;
  
  local_2a8 = hasbits;
  local_2a0 = table;
  local_298 = ctx;
  local_290 = ptr;
  local_288 = msg;
  local_280 = data.field_0;
  uVar4 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)&local_280);
  pMVar2 = local_288;
  pcVar11 = local_290;
  pPVar1 = local_298;
  if (uVar4 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&res);
    pcVar11 = MiniParse(pMVar2,pcVar11,pPVar1,(TcFieldData)res,local_2a0,local_2a8);
    return pcVar11;
  }
  local_158 = local_290 + 1;
  last.p = &local_158;
  res2 = (int64_t)&local_158;
  iVar5 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last);
  local_2b8 = (ulong)iVar5;
  if (iVar5 < '\0') {
    local_131 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last);
    local_148 = &res3;
    res3 = (long)local_131 << 7 | local_2b8 >> 0x39;
    local_d9 = local_131;
    if (res3 < 0) {
      local_119 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last)
      ;
      local_130 = &local_188;
      local_188 = (long)local_119 << 0xe | local_2b8 >> 0x32;
      local_c9 = local_119;
      if ((long)local_188 < 0) {
        local_101 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                              (&last);
        local_118 = &res3;
        res3 = ((long)local_101 << 0x15 | local_2b8 >> 0x2b) & res3;
        local_b9 = local_101;
        if (res3 < 0) {
          local_e9 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                               (&last);
          local_100 = &local_188;
          local_188 = ((long)local_e9 << 0x1c | local_2b8 >> 0x24) & local_188;
          local_a9 = local_e9;
          if ((long)local_188 < 0) {
            local_91 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                 (&last);
            local_a8 = &res3;
            res3 = ((long)local_91 << 0x23 | local_2b8 >> 0x1d) & res3;
            local_39 = local_91;
            if (res3 < 0) {
              local_79 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                   (&last);
              local_90 = &local_188;
              local_188 = ((long)local_79 << 0x2a | local_2b8 >> 0x16) & local_188;
              local_29 = local_79;
              if ((long)local_188 < 0) {
                local_61 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                           operator()(&last);
                local_78 = &res3;
                res3 = ((long)local_61 << 0x31 | local_2b8 >> 0xf) & res3;
                local_19 = local_61;
                if (res3 < 0) {
                  local_49 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                             operator()(&last);
                  local_60 = &local_188;
                  local_188 = ((long)local_49 << 0x38 | local_2b8 >> 8) & local_188;
                  local_9 = local_49;
                  if (((long)local_188 < 0) &&
                     (iVar5 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                              operator()(&last), iVar5 != '\x01')) {
                    iVar5 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                            operator()((anon_class_8_1_54a39810 *)&res2);
                    if (((int)iVar5 & 0x80U) != 0) {
                      local_150 = (char *)0x0;
                      goto LAB_0041a108;
                    }
                    bVar6 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                            operator()((anon_class_8_1_54a39810 *)&res2);
                    if ((bVar6 & 1) == 0) {
                      local_188 = local_188 ^ 0x8000000000000000;
                    }
                  }
                }
              }
            }
          }
        }
      }
      res3 = local_188 & res3;
    }
    local_2b8 = res3 & local_2b8;
    if (local_158 == (char *)0x0) {
      protobuf_assumption_failed
                ("p != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/varint_shuffle.h"
                 ,0x91);
    }
    local_150 = local_158;
  }
  else {
    local_150 = local_158;
  }
LAB_0041a108:
  pMVar2 = local_288;
  pPVar1 = local_298;
  local_290 = local_150;
  if (local_150 == (char *)0x0) {
    TcFieldData::TcFieldData((TcFieldData *)&local_2c0);
    pcVar11 = Error(pMVar2,(char *)0x0,pPVar1,(TcFieldData)local_2c0,local_2a0,local_2a8);
    return pcVar11;
  }
  bVar6 = TcFieldData::hasbit_idx((TcFieldData *)&local_280);
  pMVar2 = local_288;
  local_2a8 = 1L << (bVar6 & 0x3f) | local_2a8;
  uVar8 = TcFieldData::offset((TcFieldData *)&local_280);
  puVar12 = RefAt<unsigned_long>(pMVar2,(ulong)uVar8);
  pMVar2 = local_288;
  pcVar11 = local_290;
  pPVar1 = local_298;
  *puVar12 = local_2b8;
  TcFieldData::TcFieldData(&data_local);
  local_238 = data_local.field_0;
  local_240 = pMVar2;
  local_248 = pcVar11;
  local_250 = pPVar1;
  local_258 = local_2a0;
  uStack_260 = local_2a8;
  local_261 = 0;
  bVar7 = EpsCopyInputStream::DataAvailable(&pPVar1->super_EpsCopyInputStream,pcVar11);
  pMVar2 = local_240;
  pcVar11 = local_248;
  pPVar1 = local_250;
  if (bVar7) {
    TcFieldData::TcFieldData(&local_278);
    this = local_258;
    uVar3 = uStack_260;
    uVar9 = UnalignedLoad<unsigned_short>(pcVar11);
    uVar14 = (ulong)(int)((uint)uVar9 & (uint)this->fast_idx_mask);
    if ((uVar14 & 7) == 0) {
      data_1.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(this,uVar14 >> 3)
      ;
      local_228.data =
           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
           (ulong)uVar9;
      UNRECOVERED_JUMPTABLE =
           TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
      local_230.data = local_228.data;
      pcVar11 = (*UNRECOVERED_JUMPTABLE)(pMVar2,pcVar11,pPVar1,(TcFieldData)local_228,this,uVar3);
      return pcVar11;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  TcFieldData::TcFieldData(&local_270);
  if (local_258->has_bits_offset != 0) {
    uVar10 = (uint)uStack_260;
    puVar13 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_258->has_bits_offset);
    *puVar13 = uVar10 | *puVar13;
  }
  return pcVar11;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV64S1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return FastVarintS1<uint64_t>(PROTOBUF_TC_PARAM_PASS);
}